

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<8,454>::Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Type<8,454> *this,HEAD *head,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT)

{
  double AWR;
  double dVar1;
  vector<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
  local_48;
  
  AWR = (head->super_StructureDivision).base.fields.
        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
        _M_head_impl;
  dVar1 = (head->super_StructureDivision).base.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Head_base<0UL,_double,_false>._M_head_impl;
  readSequence<njoy::ENDFtk::section::FissionYieldData,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&local_48,(ENDFtk *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)(ulong)(uint)MAT,8,0x1c6,
             (int)(head->super_StructureDivision).base.fields.
                  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
                  _M_head_impl,SUB84(dVar1,0));
  dVar1 = round(dVar1);
  BaseWithoutMT<njoy::ENDFtk::section::Type<8,_454>_>::BaseWithoutMT
            ((BaseWithoutMT<njoy::ENDFtk::section::Type<8,_454>_> *)this,(int)dVar1,AWR);
  *(pointer *)(this + 0x10) =
       local_48.
       super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(this + 0x18) =
       local_48.
       super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(this + 0x20) =
       local_48.
       super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
  ::~vector(&local_48);
  BaseWithoutMT<njoy::ENDFtk::section::Type<8,454>>::
  readSEND<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(begin,end,lineNumber,MAT,8);
  return;
}

Assistant:

Type( HEAD& head,
      Iterator& begin,
      const Iterator& end,
      long& lineNumber,
      int MAT )
  try : Type( head.ZA(), head.AWR(),
              readSequence< FissionYieldData >( begin, end, lineNumber,
                                                MAT, 8, 454, head.L1() ) ) {
    readSEND(begin, end, lineNumber, MAT, 8 );
  } catch ( std::exception& e ) {
    Log::info( "Trouble while reading section 454 of File 8 of Material {}",
               MAT );
    throw e;
  }